

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O2

DomainSet * consensusDomains(DomainSet *__return_storage_ptr__,WeightedDomainEnsemble *dEnsemble)

{
  float fVar1;
  pointer pvVar2;
  key_type *pkVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Domain *domain;
  key_type *__k;
  reference dSetIdx;
  integer_iterator<unsigned_long> iVar6;
  pointer pWVar7;
  integer_range<unsigned_long> iVar8;
  _Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_> local_100;
  Intervals ivals;
  Domain local_c8;
  PersistenceMap pmap;
  IntervalScheduler scheduler;
  
  pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pmap._M_t._M_impl.super__Rb_tree_header._M_header;
  pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar8 = boost::irange<unsigned_long>
                    (0,((long)(dEnsemble->domainSets).
                              super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(dEnsemble->domainSets).
                             super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (iVar6.m_value =
            iVar8.super_iterator_range<boost::range_detail::integer_iterator<unsigned_long>_>.
            super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::random_access_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_value;
      iVar6.m_value !=
      iVar8.super_iterator_range<boost::range_detail::integer_iterator<unsigned_long>_>.
      super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<unsigned_long>,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_value; iVar6.m_value = iVar6.m_value + 1) {
    pvVar2 = (dEnsemble->domainSets).
             super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pkVar3 = *(pointer *)
              ((long)&pvVar2[iVar6.m_value].super__Vector_base<Domain,_std::allocator<Domain>_>.
                      _M_impl + 8);
    for (__k = *(key_type **)
                &pvVar2[iVar6.m_value].super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl;
        __k != pkVar3; __k = __k + 1) {
      fVar1 = __k->weight;
      pmVar4 = std::
               map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
               ::operator[](&pmap,__k);
      *pmVar4 = (double)fVar1;
    }
  }
  ivals.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ivals.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ivals.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var5 = pmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &pmap._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    WeightedInterval::WeightedInterval
              ((WeightedInterval *)&scheduler,p_Var5[1]._M_color,*(int *)&p_Var5[1]._M_parent,
               (double)p_Var5[1]._M_right);
    std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::emplace_back<WeightedInterval>
              (&ivals,(WeightedInterval *)&scheduler);
  }
  IntervalScheduler::IntervalScheduler(&scheduler,&ivals);
  IntervalScheduler::computeSchedule(&scheduler);
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalScheduler::extractIntervals((Intervals *)&local_100,&scheduler);
  for (pWVar7 = local_100._M_impl.super__Vector_impl_data._M_start;
      pWVar7 != local_100._M_impl.super__Vector_impl_data._M_finish; pWVar7 = pWVar7 + 1) {
    local_c8.start = (size_t)pWVar7->start;
    local_c8.end = (size_t)pWVar7->end;
    std::vector<Domain,_std::allocator<Domain>_>::emplace_back<Domain>
              (__return_storage_ptr__,&local_c8);
  }
  std::_Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>::~_Vector_base(&local_100);
  std::
  __sort<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  IntervalScheduler::~IntervalScheduler(&scheduler);
  std::_Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>::~_Vector_base
            (&ivals.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>);
  std::
  _Rb_tree<Domain,_std::pair<const_Domain,_double>,_std::_Select1st<std::pair<const_Domain,_double>_>,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
  ::~_Rb_tree(&pmap._M_t);
  return __return_storage_ptr__;
}

Assistant:

DomainSet consensusDomains(WeightedDomainEnsemble& dEnsemble) {
    using PersistenceMap = map<Domain, double>;
    PersistenceMap pmap;

    for (auto dSetIdx : boost::irange(size_t{0}, dEnsemble.domainSets.size())) {
        auto& dSet = dEnsemble.domainSets[dSetIdx];
        for (auto& domain : dSet) {
            pmap[domain] = domain.weight;
        }
    }

    Intervals ivals;

    for (auto domainPersistence : pmap) {
        auto domain = domainPersistence.first;
        auto persistence = domainPersistence.second;
        ivals.push_back(WeightedInterval(domain.start, domain.end, persistence));
    }

    IntervalScheduler scheduler(ivals);
    scheduler.computeSchedule();

    DomainSet dSet;
    for (auto ival : scheduler.extractIntervals()) {
        dSet.push_back(Domain(ival.start, ival.end));
    }

    sort(dSet.begin(), dSet.end());

    return dSet;
}